

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

bool duckdb::StringValueResult::AddRow(StringValueResult *result,idx_t buffer_pos)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  
  uVar1 = (result->super_ScannerResult).last_position.buffer_pos;
  if (uVar1 <= buffer_pos) {
    if ((result->super_ScannerResult).quoted == true) {
      AddQuotedValue(result,buffer_pos);
    }
    else if ((result->super_ScannerResult).escaped == true) {
      AddPossiblyEscapedValue
                (result,buffer_pos,result->buffer_ptr + uVar1,buffer_pos - uVar1,buffer_pos == uVar1
                );
    }
    else {
      AddValueToVector(result,result->buffer_ptr + uVar1,buffer_pos - uVar1,false);
    }
    if ((((result->super_ScannerResult).state_machine)->dialect_options).state_machine_options.
        new_line.value == CARRY_ON) {
      lVar3 = (ulong)(((result->super_ScannerResult).states)->states[1] != RECORD_SEPARATOR) + 1;
    }
    else {
      lVar3 = 1;
    }
    (result->super_ScannerResult).last_position.buffer_pos = lVar3 + buffer_pos;
  }
  bVar2 = AddRowInternal(result);
  return bVar2;
}

Assistant:

bool StringValueResult::AddRow(StringValueResult &result, const idx_t buffer_pos) {
	if (result.last_position.buffer_pos <= buffer_pos) {
		// We add the value
		if (result.quoted) {
			AddQuotedValue(result, buffer_pos);
		} else {
			char *value_ptr = result.buffer_ptr + result.last_position.buffer_pos;
			idx_t size = buffer_pos - result.last_position.buffer_pos;
			if (result.escaped) {
				AddPossiblyEscapedValue(result, buffer_pos, value_ptr, size, size == 0);
			} else {
				result.AddValueToVector(value_ptr, size);
			}
		}
		if (result.state_machine.dialect_options.state_machine_options.new_line == NewLineIdentifier::CARRY_ON) {
			if (result.states.states[1] == CSVState::RECORD_SEPARATOR) {
				// Even though this is marked as a carry on, this is a hippie mixie
				result.last_position.buffer_pos = buffer_pos + 1;
			} else {
				result.last_position.buffer_pos = buffer_pos + 2;
			}
		} else {
			result.last_position.buffer_pos = buffer_pos + 1;
		}
	}

	// We add the value
	return result.AddRowInternal();
}